

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::ValidateQualifiedName(DescriptorBuilder *this,string *name)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  bool bVar4;
  
  if (name->_M_string_length == 0) {
    return false;
  }
  sVar3 = 0;
  bVar4 = false;
  do {
    bVar1 = (name->_M_dataplus)._M_p[sVar3];
    if ((char)bVar1 < 'a') {
      if ((char)bVar1 < 'A') {
        if ((char)bVar1 < '0') {
          if (bVar1 != 0x2e) {
            return false;
          }
          bVar2 = true;
          if (bVar4) {
            return false;
          }
        }
        else {
          bVar2 = false;
          if (0x39 < bVar1) {
            return false;
          }
        }
      }
      else {
        bVar2 = false;
        if (bVar1 != 0x5f && 0x5a < bVar1) {
          return false;
        }
      }
    }
    else {
      bVar2 = false;
      if (0x7a < bVar1) {
        return false;
      }
    }
    bVar4 = bVar2;
    sVar3 = sVar3 + 1;
    if (name->_M_string_length == sVar3) {
      return (bool)(bVar4 ^ 1);
    }
  } while( true );
}

Assistant:

bool DescriptorBuilder::ValidateQualifiedName(const string& name) {
  bool last_was_period = false;

  for (int i = 0; i < name.size(); i++) {
    // I don't trust isalnum() due to locales.  :(
    if (('a' <= name[i] && name[i] <= 'z') ||
        ('A' <= name[i] && name[i] <= 'Z') ||
        ('0' <= name[i] && name[i] <= '9') ||
        (name[i] == '_')) {
      last_was_period = false;
    } else if (name[i] == '.') {
      if (last_was_period) return false;
      last_was_period = true;
    } else {
      return false;
    }
  }

  return !name.empty() && !last_was_period;
}